

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall ON_wString::RichTextExample(ON_wString *this,ON_Font *font)

{
  bool bVar1;
  bool bItalic;
  bool bBoldItalic;
  undefined1 local_68 [40];
  undefined1 local_40 [8];
  ON_FontFaceQuartet q;
  ON_Font *font_local;
  
  q.m_bold_italic = font;
  if (font == (ON_Font *)0x0) {
    q.m_bold_italic = &ON_Font::Default;
  }
  ON_Font::FontQuartet((ON_FontFaceQuartet *)local_40,q.m_bold_italic);
  bVar1 = ON_FontFaceQuartet::IsNotEmpty((ON_FontFaceQuartet *)local_40);
  if (bVar1) {
    ON_FontFaceQuartet::QuartetName((ON_FontFaceQuartet *)(local_68 + 0x10));
    bVar1 = ON_FontFaceQuartet::HasBoldFace((ON_FontFaceQuartet *)local_40);
    bItalic = ON_FontFaceQuartet::HasItalicFace((ON_FontFaceQuartet *)local_40);
    bBoldItalic = ON_FontFaceQuartet::HasBoldItalicFace((ON_FontFaceQuartet *)local_40);
    RichTextExample(this,(ON_wString *)(local_68 + 0x10),bVar1,bItalic,bBoldItalic,true);
    ~ON_wString((ON_wString *)(local_68 + 0x10));
  }
  else {
    ON_Font::RichTextFontName((ON_Font *)local_68);
    RichTextExample(this,(ON_wString *)local_68,true,true,true,true);
    ~ON_wString((ON_wString *)local_68);
  }
  local_68._12_4_ = 1;
  ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)local_40);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RichTextExample(
  const ON_Font* font
)
{
  if (nullptr == font)
    font = &ON_Font::Default;
  const ON_FontFaceQuartet q = font->FontQuartet();
  if (q.IsNotEmpty())
  {
    // restrict example to supported faces
    // Many fonts (Arial Black, Corsiva, ...) do not have all 4 rich text faces.
    return ON_wString::RichTextExample(q.QuartetName(), q.HasBoldFace(), q.HasItalicFace(), q.HasBoldItalicFace(), true);
  }

  return ON_wString::RichTextExample(font->RichTextFontName(), true, true, true, true);
}